

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void vorbis_init(stb_vorbis *p,stb_vorbis_alloc *z)

{
  undefined8 *in_RSI;
  long in_RDI;
  
  SDL_memset(in_RDI,0,0x720);
  if (in_RSI != (undefined8 *)0x0) {
    *(undefined8 *)(in_RDI + 0x80) = *in_RSI;
    *(undefined8 *)(in_RDI + 0x88) = in_RSI[1];
    *(uint *)(in_RDI + 0x88) = *(uint *)(in_RDI + 0x88) & 0xfffffff8;
    *(undefined4 *)(in_RDI + 0x94) = *(undefined4 *)(in_RDI + 0x88);
  }
  *(undefined4 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0x9c) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined4 *)(in_RDI + 0x710) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

static void vorbis_init(stb_vorbis *p, const stb_vorbis_alloc *z)
{
   memset(p, 0, sizeof(*p)); // NULL out all malloc'd pointers to start
   if (z) {
      p->alloc = *z;
      p->alloc.alloc_buffer_length_in_bytes &= ~7;
      p->temp_offset = p->alloc.alloc_buffer_length_in_bytes;
   }
   p->eof = 0;
   p->error = VORBIS__no_error;
   p->stream = NULL;
   p->codebooks = NULL;
   p->page_crc_tests = -1;
   #ifndef STB_VORBIS_NO_STDIO
   p->close_on_free = FALSE;
   p->f = NULL;
   #endif
}